

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

void ssllabs::Endpoint::parseHstsPolicy(ConstObject *obj,labsHstsPolicy_t *hstsPolicy)

{
  bool bVar1;
  ValueType *pVVar2;
  int64_t iVar3;
  
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"LONG_MAX_AGE");
  if (bVar1) {
    pVVar2 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"LONG_MAX_AGE");
    if ((undefined1  [16])((undefined1  [16])pVVar2->data_ & (undefined1  [16])0x80000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"LONG_MAX_AGE");
      iVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt64(pVVar2);
      hstsPolicy->LONG_MAX_AGE = iVar3;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"header");
  if (bVar1) {
    pVVar2 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"header");
    if ((undefined1  [16])((undefined1  [16])pVVar2->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"header");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pVVar2);
      std::__cxx11::string::assign((char *)&hstsPolicy->Header);
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"status");
  if (bVar1) {
    pVVar2 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"status");
    if ((undefined1  [16])((undefined1  [16])pVVar2->data_ & (undefined1  [16])0x400000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"status");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pVVar2);
      std::__cxx11::string::assign((char *)&hstsPolicy->Status);
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"maxAge");
  if (bVar1) {
    pVVar2 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)obj,"maxAge");
    if ((undefined1  [16])((undefined1  [16])pVVar2->data_ & (undefined1  [16])0x80000000000000) !=
        (undefined1  [16])0x0) {
      pVVar2 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)obj,"maxAge");
      iVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt64(pVVar2);
      hstsPolicy->MaxAge = iVar3;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"directives");
  if (bVar1) {
    rapidjson::
    GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
    ::operator[]<char_const>
              ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                *)obj,"directives");
    return;
  }
  return;
}

Assistant:

void Endpoint::parseHstsPolicy(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::ConstObject &obj, labsHstsPolicy_t &hstsPolicy) {

        if (obj.HasMember("LONG_MAX_AGE") && obj["LONG_MAX_AGE"].IsInt64()) {
            hstsPolicy.LONG_MAX_AGE = obj["LONG_MAX_AGE"].GetInt64();
        }

        if (obj.HasMember("header") && obj["header"].IsString()) {
            hstsPolicy.Header.assign(obj["header"].GetString());
        }

        if (obj.HasMember("status") && obj["status"].IsString()) {
            hstsPolicy.Status.assign(obj["status"].GetString());
        }

        if (obj.HasMember("maxAge") && obj["maxAge"].IsInt64()) {
            hstsPolicy.MaxAge = obj["maxAge"].GetInt64();
        }

        if (obj.HasMember("directives") && obj["directives"].IsObject()) {

        }

        return;
    }